

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

Status cmSystemTools::CreateSymlinkQuietly(string *origName,string *newName)

{
  int iVar1;
  char *path;
  char *new_path;
  int err;
  int flags;
  uv_fs_t req;
  string *newName_local;
  string *origName_local;
  Status status;
  
  req.bufsml[3].len = (size_t)newName;
  path = (char *)std::__cxx11::string::c_str();
  new_path = (char *)std::__cxx11::string::c_str();
  iVar1 = uv_fs_symlink((uv_loop_t *)0x0,(uv_fs_t *)&err,path,new_path,0,(uv_fs_cb)0x0);
  cmsys::Status::Status((Status *)&origName_local);
  if (iVar1 != 0) {
    iVar1 = uv_fs_get_system_error((uv_fs_t *)&err);
    origName_local = (string *)cmsys::Status::POSIX(iVar1);
  }
  return (Status)origName_local;
}

Assistant:

cmsys::Status cmSystemTools::CreateSymlinkQuietly(std::string const& origName,
                                                  std::string const& newName)
{
  uv_fs_t req;
  int flags = 0;
#if defined(_WIN32)
  if (cmsys::SystemTools::FileIsDirectory(origName)) {
    flags |= UV_FS_SYMLINK_DIR;
  }
#endif
  int err = uv_fs_symlink(nullptr, &req, origName.c_str(), newName.c_str(),
                          flags, nullptr);
  cmsys::Status status;
  if (err) {
#if defined(_WIN32)
    status = cmsys::Status::Windows(uv_fs_get_system_error(&req));
#elif UV_VERSION_MAJOR > 1 || (UV_VERSION_MAJOR == 1 && UV_VERSION_MINOR >= 38)
    status = cmsys::Status::POSIX(uv_fs_get_system_error(&req));
#else
    status = cmsys::Status::POSIX(-err);
#endif
  }
  return status;
}